

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O3

bool __thiscall
EDLines::TryToJoinTwoLineSegments(EDLines *this,LineSegment *ls1,LineSegment *ls2,int changeIndex)

{
  double dVar1;
  double dVar2;
  double y1;
  int iVar3;
  LineSegment *pLVar4;
  char cVar5;
  int iVar6;
  LineSegment *pLVar7;
  long lVar8;
  pointer pLVar9;
  byte bVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  int local_7c;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  bVar10 = 0;
  dVar11 = ComputeMinDistanceBetweenTwoLines(ls1,ls2,&local_7c);
  if (this->max_distance_between_two_lines <= dVar11 &&
      dVar11 != this->max_distance_between_two_lines) {
    return false;
  }
  local_48 = ls1->sx;
  dStack_40 = ls1->sy;
  local_58 = ls1->ex;
  dStack_50 = ls1->ey;
  local_68 = ls2->sx;
  dStack_60 = ls2->sy;
  local_78 = ls2->ex;
  dStack_70 = ls2->ey;
  auVar14._0_8_ =
       (local_48 - local_58) * (local_48 - local_58) +
       (dStack_40 - dStack_50) * (dStack_40 - dStack_50);
  auVar14._8_8_ =
       (local_68 - local_78) * (local_68 - local_78) +
       (dStack_60 - dStack_70) * (dStack_60 - dStack_70);
  auVar14 = sqrtpd(auVar14,auVar14);
  pLVar7 = ls2;
  pLVar4 = ls1;
  if (auVar14._8_8_ < auVar14._0_8_) {
    pLVar7 = ls1;
    pLVar4 = ls2;
  }
  dVar11 = pLVar4->sx;
  dVar13 = pLVar4->sy;
  dVar15 = pLVar7->a;
  dVar1 = pLVar7->b;
  iVar3 = pLVar7->invert;
  dVar12 = ComputeMinDistance(dVar11,dVar13,dVar15,dVar1,iVar3);
  dVar2 = pLVar4->ex;
  y1 = pLVar4->ey;
  dVar11 = ComputeMinDistance((dVar11 + dVar2) * 0.5,(dVar13 + y1) * 0.5,dVar15,dVar1,iVar3);
  dVar13 = ComputeMinDistance(dVar2,y1,dVar15,dVar1,iVar3);
  dVar11 = (dVar13 + dVar11 + dVar12) / 3.0;
  if (this->max_error <= dVar11 && dVar11 != this->max_error) {
    return false;
  }
  dVar13 = ABS(dStack_40 - dStack_70) + ABS(local_48 - local_78);
  dVar15 = ABS(dStack_40 - dStack_60) + ABS(local_48 - local_68);
  dVar11 = dVar13;
  if (dVar13 <= dVar15) {
    dVar11 = dVar15;
  }
  dVar1 = ABS(dStack_50 - dStack_60) + ABS(local_58 - local_68);
  dVar2 = dVar1;
  if (dVar1 <= dVar11) {
    dVar2 = dVar11;
  }
  if (ABS(dStack_50 - dStack_70) + ABS(local_58 - local_78) <= dVar2) {
    cVar5 = '\x03';
    if (dVar1 <= dVar11) {
      cVar5 = (dVar15 < dVar13) + '\x01';
    }
    if (cVar5 == '\x03') {
      ls1->sx = local_68;
      ls1->sy = dStack_60;
    }
    else {
      if (cVar5 == '\x02') goto LAB_0011814d;
      ls1->ex = local_68;
      ls1->ey = dStack_60;
    }
  }
  else {
    ls1->sx = local_58;
    ls1->sy = dStack_50;
LAB_0011814d:
    ls1->ex = local_78;
    ls1->ey = dStack_70;
  }
  iVar3 = ls1->len;
  iVar6 = ls2->len;
  if (ls1->firstPixelIndex + iVar3 + 5 < ls2->firstPixelIndex) {
    if (iVar6 <= iVar3) goto LAB_00118178;
    ls1->firstPixelIndex = ls2->firstPixelIndex;
  }
  else {
    iVar6 = iVar6 + iVar3;
  }
  ls1->len = iVar6;
LAB_00118178:
  UpdateLineParameters(ls1);
  pLVar9 = (this->lines).super__Vector_base<LineSegment,_std::allocator<LineSegment>_>._M_impl.
           super__Vector_impl_data._M_start + changeIndex;
  pLVar9->len = ls1->len;
  for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
    pLVar9->a = ls1->a;
    ls1 = (LineSegment *)((long)ls1 + (ulong)bVar10 * -0x10 + 8);
    pLVar9 = (pointer)((long)pLVar9 + ((ulong)bVar10 * -2 + 1) * 8);
  }
  return true;
}

Assistant:

bool EDLines::TryToJoinTwoLineSegments(LineSegment * ls1, LineSegment * ls2, int changeIndex)
{	
	int which;
	double dist = ComputeMinDistanceBetweenTwoLines(ls1, ls2, &which);
	if (dist > max_distance_between_two_lines) return false;

	// Compute line lengths. Use the longer one as the ground truth
	double dx = ls1->sx - ls1->ex;
	double dy = ls1->sy - ls1->ey;
	double prevLen = sqrt(dx*dx + dy*dy);

	dx = ls2->sx - ls2->ex;
	dy = ls2->sy - ls2->ey;
	double nextLen = sqrt(dx*dx + dy*dy);

	// Use the longer line as the ground truth
	LineSegment *shorter = ls1;
	LineSegment *longer = ls2;

	if (prevLen > nextLen) { shorter = ls2; longer = ls1; }

#if 0
	// Use 5 points to check for collinearity  
#define POINT_COUNT 5
	double decr = 1.0 / (POINT_COUNT - 1);
	double alpha = 1.0;
	dist = 0.0;

	while (alpha >= 0.0) {
		double px = alpha*shorter->sx + (1.0 - alpha)*shorter->ex;
		double py = alpha*shorter->sy + (1.0 - alpha)*shorter->ey;

		dist += ComputeMinDistance(px, py, longer->a, longer->b, longer->invert);

		alpha -= decr;
	} //end-while

	dist /= POINT_COUNT;

#undef POINT_COUNT

#else
	// Just use 3 points to check for collinearity  
	dist = ComputeMinDistance(shorter->sx, shorter->sy, longer->a, longer->b, longer->invert);
	dist += ComputeMinDistance((shorter->sx + shorter->ex) / 2.0, (shorter->sy + shorter->ey) / 2.0, longer->a, longer->b, longer->invert);
	dist += ComputeMinDistance(shorter->ex, shorter->ey, longer->a, longer->b, longer->invert);

	dist /= 3.0;
#endif

	if (dist > max_error) return false;

#if 0
	// Update the end points of ls1
	if (which == 0) {       // SS
		ls1->sx = ls2->ex;
		ls1->sy = ls2->ey;

	}
	else if (which == 1) { // SE
		ls1->sx = ls2->sx;
		ls1->sy = ls2->sy;

	}
	else if (which == 2) { // ES
		ls1->ex = ls2->ex;
		ls1->ey = ls2->ey;

	}
	else {                // EE
		ls1->ex = ls2->sx;
		ls1->ey = ls2->sy;
	} //end-else

#else
	/// 4 cases: 1:(s1, s2), 2:(s1, e2), 3:(e1, s2), 4:(e1, e2)

	/// case 1: (s1, s2)
	dx = fabs(ls1->sx - ls2->sx);
	dy = fabs(ls1->sy - ls2->sy);
	double d = dx + dy;
	double max = d;
	which = 1;

	/// case 2: (s1, e2)
	dx = fabs(ls1->sx - ls2->ex);
	dy = fabs(ls1->sy - ls2->ey);
	d = dx + dy;
	if (d > max) {
		max = d;
		which = 2;
	} //end-if

	  /// case 3: (e1, s2)
	dx = fabs(ls1->ex - ls2->sx);
	dy = fabs(ls1->ey - ls2->sy);
	d = dx + dy;
	if (d > max) {
		max = d;
		which = 3;
	} //end-if

	  /// case 4: (e1, e2)
	dx = fabs(ls1->ex - ls2->ex);
	dy = fabs(ls1->ey - ls2->ey);
	d = dx + dy;
	if (d > max) {
		max = d;
		which = 4;
	} //end-if

	if (which == 1) {
		// (s1, s2)
		ls1->ex = ls2->sx;
		ls1->ey = ls2->sy;

	}
	else if (which == 2) {
		// (s1, e2)
		ls1->ex = ls2->ex;
		ls1->ey = ls2->ey;

	}
	else if (which == 3) {
		// (e1, s2)
		ls1->sx = ls2->sx;
		ls1->sy = ls2->sy;

	}
	else {
		// (e1, e2)
		ls1->sx = ls1->ex;
		ls1->sy = ls1->ey;

		ls1->ex = ls2->ex;
		ls1->ey = ls2->ey;
	} //end-else

#endif

	  // Update the first line's parameters
	if (ls1->firstPixelIndex + ls1->len + 5 >= ls2->firstPixelIndex) ls1->len += ls2->len;
	else if (ls2->len > ls1->len) {
		ls1->firstPixelIndex = ls2->firstPixelIndex;
		ls1->len = ls2->len;
	} //end-if

	UpdateLineParameters(ls1);
	lines[changeIndex] = *ls1;

	return true;
}